

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_key.cpp
# Opt level: O0

bool make_entry(value *val,string *type,string *algo,string *file,int bytes)

{
  byte bVar1;
  string *psVar2;
  ulong uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  value *other;
  string *in_RCX;
  string *in_RDI;
  bool bVar6;
  ofstream f;
  string key;
  value *in_stack_fffffffffffffb88;
  value *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  allocator *paVar7;
  value *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffbb0;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [40];
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [44];
  uint local_2bc;
  long local_2b8 [64];
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [72];
  string *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  cppcms::json::value::value<std::__cxx11::string>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  psVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"session",&local_59);
  psVar2 = (string *)cppcms::json::value::operator[](psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"client",&local_91);
  psVar2 = (string *)cppcms::json::value::operator[](psVar2);
  cppcms::json::value::operator[](psVar2);
  cppcms::json::value::operator=(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cppcms::json::value::~value((value *)0x10486a);
  make_key_abi_cxx11_((int)((ulong)in_RCX >> 0x20));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar4 = std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_2b8,uVar4,0x10);
    bVar1 = std::ios::operator!((ios *)((long)local_2b8 + *(long *)(local_2b8[0] + -0x18)));
    bVar6 = (bVar1 & 1) != 0;
    if (bVar6) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
      poVar5 = std::operator<<(poVar5,in_RCX);
      std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)local_2b8,local_b8);
      std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
      std::ofstream::close();
      cppcms::json::value::value<std::__cxx11::string>
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"session",&local_2e9);
      psVar2 = (string *)cppcms::json::value::operator[](local_10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,"client",&local_311);
      psVar2 = (string *)cppcms::json::value::operator[](psVar2);
      std::operator+(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      cppcms::json::value::operator[](psVar2);
      cppcms::json::value::operator=(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      cppcms::json::value::~value((value *)0x104b96);
    }
    local_2bc = (uint)bVar6;
    std::ofstream::~ofstream(local_2b8);
    if (local_2bc != 0) goto LAB_00104eb1;
  }
  else {
    cppcms::json::value::value<std::__cxx11::string>
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    __rhs = &local_361;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"session",__rhs);
    psVar2 = (string *)cppcms::json::value::operator[](local_10);
    paVar7 = &local_389;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"client",paVar7);
    psVar2 = (string *)cppcms::json::value::operator[](psVar2);
    std::operator+(in_stack_fffffffffffffbb8,(char *)__rhs);
    other = (value *)cppcms::json::value::operator[](psVar2);
    cppcms::json::value::operator=((value *)psVar2,other);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    cppcms::json::value::~value((value *)0x104dda);
  }
  local_1 = 1;
  local_2bc = 1;
LAB_00104eb1:
  std::__cxx11::string::~string(local_b8);
  return (bool)(local_1 & 1);
}

Assistant:

bool make_entry(cppcms::json::value &val,std::string type,std::string algo,std::string file,int bytes)
{
	val["session"]["client"][type]=algo;
	std::string key=make_key(bytes);
	if(!file.empty()) {
		std::ofstream f(file.c_str());
		if(!f) {
			std::cerr << "Failed to open file " << file << std::endl;
			return false;
		}
		f << key << std::endl;
		f.close();
		val["session"]["client"][type +"_key_file"]=file;
	}
	else {
		val["session"]["client"][type+"_key"] = key;
	}
	return true;
}